

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O2

int crypto_sign(uchar *sm,unsigned_long_long *smlen,uchar *m,unsigned_long_long mlen,uchar *sk)

{
  size_t sVar1;
  int iVar2;
  size_t signature_len;
  picnic_privatekey_t psk;
  
  if (*sk == '\t') {
    signature_len = 0xee60;
    iVar2 = picnic_read_private_key(&psk,sk,0x61);
    if (iVar2 < 0) {
      picnic_clear_private_key(&psk);
    }
    else {
      iVar2 = picnic_sign(&psk,m,mlen,sm + mlen + 4,&signature_len);
      picnic_clear_private_key(&psk);
      sVar1 = signature_len;
      if (iVar2 == 0) {
        *smlen = mlen + 4 + signature_len;
        memmove(sm + 4,m,mlen);
        iVar2 = 0;
        *(int *)sm = (int)sVar1;
      }
    }
  }
  else {
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

int crypto_sign(unsigned char* sm, unsigned long long* smlen, const unsigned char* m,
                unsigned long long mlen, const unsigned char* sk) {
  // The first byte encodes the parameter set and is public.
  picnic_declassify(&sk[0], sizeof(unsigned char));
  if (sk[0] != Picnic3_L5) {
    return -3;
  }

  size_t signature_len = PICNIC_SIGNATURE_SIZE(Picnic3_L5);
  uint32_t len         = 0;

  picnic_privatekey_t psk;
  int ret = picnic_read_private_key(&psk, sk, PICNIC_PRIVATE_KEY_SIZE(Picnic3_L5));
  if (ret < 0) {
    picnic_clear_private_key(&psk);
    return ret;
  }

  ret = picnic_sign(&psk, m, mlen, sm + sizeof(len) + mlen, &signature_len);
  picnic_clear_private_key(&psk);
  if (ret) {
    return ret;
  }

  len    = htole32(signature_len);
  *smlen = sizeof(len) + mlen + signature_len;
  // Move the message first in case m and sm overlap.
  memmove(sm + sizeof(len), m, mlen);
  memcpy(sm, &len, sizeof(len));

  return 0;
}